

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot
          (QNetworkReplyHttpImplPrivate *this,qint64 bytesReceived,qint64 bytesTotal)

{
  __atomic_base<int> _Var1;
  QNetworkReply *this_00;
  element_type *peVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  cVar3 = QIODevice::isOpen();
  if (cVar3 != '\0') {
    peVar2 = (this->pendingDownloadProgressEmissions).
             super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    _Var1._M_i = (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i;
    (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0 ||
         SBORROW4(_Var1._M_i,1) !=
         (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i < 0) && (cVar3 = QIODevice::isOpen(), cVar3 != '\0')) {
      if ((this->cacheEnabled == true) &&
         ((bytesReceived == bytesTotal &&
          ((this->super_QNetworkReplyPrivate).operation - HeadOperation < 2)))) {
        initCacheSaveDevice(this);
        if ((this->cacheSaveDevice != (QIODevice *)0x0) && (this->cacheEnabled == true)) {
          QIODevice::write((char *)this->cacheSaveDevice,(longlong)this->downloadZerocopyBuffer);
        }
      }
      bVar4 = QHttpNetworkRequest::isFollowRedirects(&this->httpRequest);
      if ((bVar4) && (bVar4 = QHttpNetworkReply::isHttpRedirect(this->statusCode), bVar4)) {
        return;
      }
      this->bytesDownloaded = bytesReceived;
      setupTransferTimeout(this);
      this->downloadBufferCurrentSize = bytesReceived;
      if (0 < this->bytesDownloaded) {
        QIODevice::readyRead();
      }
      cVar3 = QElapsedTimer::isValid();
      if ((cVar3 != '\0') && (lVar5 = QElapsedTimer::elapsed(), 99 < lVar5)) {
        QElapsedTimer::start();
        QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,bytesTotal);
        return;
      }
    }
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot(qint64 bytesReceived,  qint64 bytesTotal)
{
    Q_Q(QNetworkReplyHttpImpl);

    // If we're closed just ignore this data
    if (!q->isOpen())
        return;

    // we can be sure here that there is a download buffer

    int pendingSignals = (int)pendingDownloadProgressEmissions->fetchAndAddAcquire(-1) - 1;
    if (pendingSignals > 0) {
        // Let's ignore this signal and look at the next one coming in
        // (signal comppression)
        return;
    }

    if (!q->isOpen())
        return;

    if (cacheEnabled && isCachingAllowed() && bytesReceived == bytesTotal) {
        // Write everything in one go if we use a download buffer. might be more performant.
        initCacheSaveDevice();
        // need to check again if cache enabled and device exists
        if (cacheSaveDevice && cacheEnabled)
            cacheSaveDevice->write(downloadZerocopyBuffer, bytesTotal);
        // FIXME where is it closed?
    }

    if (isHttpRedirectResponse())
        return;

    bytesDownloaded = bytesReceived;
    setupTransferTimeout();

    downloadBufferCurrentSize = bytesReceived;

    // Only emit readyRead when actual data is there
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (bytesDownloaded > 0)
        emit q->readyRead();
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, bytesTotal);
    }
}